

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsc.c
# Opt level: O0

int Dsc_CountAnds_rec(char *pStr,char **p,int *pMatches)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *q_2;
  int Counter_1;
  char *q_1;
  int AddOn;
  int Counter;
  char *q;
  int *pMatches_local;
  char **p_local;
  char *pStr_local;
  
  if (**p == '!') {
    *p = *p + 1;
  }
  while( true ) {
    if (((**p < 'A') || (bVar1 = true, 'F' < **p)) && (bVar1 = false, '/' < **p)) {
      bVar1 = **p < ':';
    }
    if (!bVar1) break;
    *p = *p + 1;
  }
  if ((**p == '<') && (pStr[(long)pMatches[(long)*p - (long)pStr] + 1] == '{')) {
    *p = pStr + (long)pMatches[(long)*p - (long)pStr] + 1;
  }
  if ((**p < 'a') || ('z' < **p)) {
    if ((**p == '(') || (**p == '[')) {
      q_1._4_4_ = 0;
      iVar3 = 3;
      if (**p == '(') {
        iVar3 = 1;
      }
      pcVar4 = pStr + pMatches[(long)*p - (long)pStr];
      if ((int)*pcVar4 != **p + 1 + (uint)(**p != '(')) {
        __assert_fail("*q == **p + 1 + (**p != \'(\')",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dsc/dsc.c"
                      ,0x1ea,"int Dsc_CountAnds_rec(char *, char **, int *)");
      }
      *p = *p + 1;
      while (*p < pcVar4) {
        iVar2 = Dsc_CountAnds_rec(pStr,p,pMatches);
        q_1._4_4_ = iVar3 + iVar2 + q_1._4_4_;
        *p = *p + 1;
      }
      if (*p != pcVar4) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dsc/dsc.c"
                      ,0x1ed,"int Dsc_CountAnds_rec(char *, char **, int *)");
      }
      pStr_local._4_4_ = q_1._4_4_ - iVar3;
    }
    else {
      if ((**p != '<') && (**p != '{')) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dsc/dsc.c"
                      ,0x1fa,"int Dsc_CountAnds_rec(char *, char **, int *)");
      }
      q_2._4_4_ = 3;
      pcVar4 = pStr + pMatches[(long)*p - (long)pStr];
      if ((int)*pcVar4 != **p + 1 + (uint)(**p != '(')) {
        __assert_fail("*q == **p + 1 + (**p != \'(\')",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dsc/dsc.c"
                      ,500,"int Dsc_CountAnds_rec(char *, char **, int *)");
      }
      *p = *p + 1;
      while (*p < pcVar4) {
        iVar3 = Dsc_CountAnds_rec(pStr,p,pMatches);
        q_2._4_4_ = iVar3 + q_2._4_4_;
        *p = *p + 1;
      }
      if (*p != pcVar4) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dsc/dsc.c"
                      ,0x1f7,"int Dsc_CountAnds_rec(char *, char **, int *)");
      }
      pStr_local._4_4_ = q_2._4_4_;
    }
  }
  else {
    pStr_local._4_4_ = 0;
  }
  return pStr_local._4_4_;
}

Assistant:

int Dsc_CountAnds_rec( char * pStr, char ** p, int * pMatches )
{
    if ( **p == '!' )
        (*p)++;
    while ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
        (*p)++;
    if ( **p == '<' )
    {
        char * q = pStr + pMatches[*p - pStr];
        if ( *(q+1) == '{' )
            *p = q+1;
    }
    if ( **p >= 'a' && **p <= 'z' ) // var
        return 0;
    if ( **p == '(' || **p == '[' ) // and/or/xor
    {
        int Counter = 0, AddOn = (**p == '(')? 1 : 3;
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
            Counter += AddOn + Dsc_CountAnds_rec( pStr, p, pMatches );
        assert( *p == q );
        return Counter - AddOn;
    }
    if ( **p == '<' || **p == '{' ) // mux
    {
        int Counter = 3;
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
            Counter += Dsc_CountAnds_rec( pStr, p, pMatches );
        assert( *p == q );
        return Counter;
    }
    assert( 0 );
    return 0;
}